

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void StrToNumVectorHelper<std::vector<int,std::allocator<int>>>
               (string *source,vector<int,_std::allocator<int>_> *dest,value_type_conflict3 *def)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  istream *piVar4;
  char *__nptr;
  long lVar5;
  value_type_conflict3 local_1f8;
  char local_1f1;
  char *local_1f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  char *local_1e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  remove_ret;
  string local_1c8 [8];
  string item;
  stringstream ss;
  value_type_conflict3 *def_local;
  vector<int,_std::allocator<int>_> *dest_local;
  string *source_local;
  
  std::vector<int,_std::allocator<int>_>::clear(dest);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(item.field_2._M_local_buf + 8),(string *)source,_Var2);
    std::__cxx11::string::string(local_1c8);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(item.field_2._M_local_buf + 8),local_1c8,',');
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar1) break;
      local_1e8._M_current = (char *)std::__cxx11::string::begin();
      local_1f0 = (char *)std::__cxx11::string::end();
      local_1f1 = ' ';
      local_1e0 = (char *)std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                                    (local_1e8,
                                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_1f0,&local_1f1);
      __nptr = (char *)std::__cxx11::string::c_str();
      lVar5 = strtol(__nptr,(char **)0x0,0);
      local_1f8 = (value_type_conflict3)lVar5;
      std::vector<int,_std::allocator<int>_>::push_back(dest,&local_1f8);
    }
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(dest);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back(dest,def);
    }
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)(item.field_2._M_local_buf + 8));
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back(dest,def);
  }
  return;
}

Assistant:

inline void StrToNumVectorHelper(const std::string &source, TList &dest, const typename TList::value_type &def)
{
    typedef typename TList::value_type T;
    dest.clear();

    if(!source.empty())
    {
        std::stringstream ss(source);
        std::string item;
        while(std::getline(ss, item, ','))
        {
            auto remove_ret = std::remove(item.begin(), item.end(), ' '); //-V530
            (void)remove_ret;

            try
            {
                if(std::is_same<T, int>::value ||
                   std::is_same<T, long>::value ||
                   std::is_same<T, short>::value)
                    dest.push_back(static_cast<T>(std::strtol(item.c_str(), NULL, 0)));
                else if(std::is_same<T, unsigned int>::value ||
                        std::is_same<T, unsigned long>::value ||
                        std::is_same<T, unsigned short>::value)
                    dest.push_back(static_cast<T>(std::strtoul(item.c_str(), NULL, 0)));
                else if(std::is_same<T, float>::value)
                    dest.push_back(std::strtof(item.c_str(), NULL));
                else
                    dest.push_back(std::strtod(item.c_str(), NULL));
            }
            catch(...)
            {
                dest.pop_back();
            }
        }

        if(dest.empty())
            dest.push_back(def);
    }
    else
        dest.push_back(def);
}